

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void desc_art_fake(wchar_t a_idx)

{
  bool bVar1;
  _Bool _Var2;
  undefined1 local_330 [8];
  region_conflict area;
  textblock *tb;
  char header [120];
  undefined1 auStack_290 [7];
  _Bool fake;
  object known_object_body;
  object object_body;
  object *known_obj;
  object *obj;
  wchar_t a_idx_local;
  
  object_body.note = 0;
  memset(&known_object_body.note,0,0x138);
  memset(auStack_290,0,0x138);
  bVar1 = false;
  memset(local_330,0,0x10);
  known_obj = find_artifact(a_info + a_idx);
  if (known_obj == (object *)0x0) {
    bVar1 = true;
    known_obj = (object *)&known_object_body.note;
    object_body.note = (quark_t)auStack_290;
    make_fake_artifact(known_obj,a_info + a_idx);
    _auStack_290 = (object_kind *)known_object_body.note;
    _Var2 = history_is_artifact_known(player,(artifact *)object_body.ego);
    if (_Var2) {
      object_copy((object *)object_body.note,known_obj);
    }
  }
  handle_stuff(player);
  area._8_8_ = object_info(known_obj,OINFO_NONE);
  object_desc((char *)&tb,0x78,known_obj,0xc3,player);
  if (bVar1) {
    object_wipe((object *)object_body.note);
    object_wipe(known_obj);
  }
  textui_textblock_show((textblock *)area._8_8_,_local_330,(char *)&tb);
  textblock_free((textblock *)area._8_8_);
  return;
}

Assistant:

static void desc_art_fake(int a_idx)
{
	struct object *obj, *known_obj = NULL;
	struct object object_body = OBJECT_NULL, known_object_body = OBJECT_NULL;
	bool fake = false;

	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	obj = find_artifact(&a_info[a_idx]);

	/* If it's been lost, make a fake artifact for it */
	if (!obj) {
		fake = true;
		obj = &object_body;
		known_obj = &known_object_body;

		make_fake_artifact(obj, &a_info[a_idx]);
		obj->known = known_obj;
		known_obj->artifact = obj->artifact;
		known_obj->kind = obj->kind;

		/* Check the history entry, to see if it was fully known before it
		 * was lost */
		if (history_is_artifact_known(player, obj->artifact))
			/* Be very careful not to influence anything but this object */
			object_copy(known_obj, obj);
	}

	/* Hack -- Handle stuff */
	handle_stuff(player);

	tb = object_info(obj, OINFO_NONE);
	object_desc(header, sizeof(header), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_CAPITAL, player);
	if (fake) {
		object_wipe(known_obj);
		object_wipe(obj);
	}

	textui_textblock_show(tb, area, header);
	textblock_free(tb);
}